

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# env_posix.cc
# Opt level: O1

Status __thiscall
leveldb::anon_unknown_1::PosixWritableFile::Append(PosixWritableFile *this,Slice *data)

{
  _func_int **in_RAX;
  undefined8 *in_RDX;
  ulong uVar1;
  void *pvVar2;
  ulong __n;
  ulong uVar3;
  Status status;
  WritableFile local_38;
  
  pvVar2 = (void *)*in_RDX;
  uVar3 = in_RDX[1];
  uVar1 = 0x10000 - data[0x1000].size_;
  __n = uVar3;
  if (uVar1 < uVar3) {
    __n = uVar1;
  }
  local_38._vptr_WritableFile = in_RAX;
  memcpy((void *)((long)&data->size_ + data[0x1000].size_),pvVar2,__n);
  data[0x1000].size_ = data[0x1000].size_ + __n;
  if (uVar1 < uVar3) {
    WriteUnbuffered((PosixWritableFile *)&stack0xffffffffffffffc8,(char *)data,(size_t)&data->size_)
    ;
    data[0x1000].size_ = 0;
    if (local_38._vptr_WritableFile == (_func_int **)0x0) {
      pvVar2 = (void *)((long)pvVar2 + __n);
      uVar3 = uVar3 - __n;
      if (uVar3 < 0x10000) {
        memcpy(&data->size_,pvVar2,uVar3);
        data[0x1000].size_ = uVar3;
        (this->super_WritableFile)._vptr_WritableFile = (_func_int **)0x0;
      }
      else {
        WriteUnbuffered(this,(char *)data,(size_t)pvVar2);
      }
    }
    else {
      (this->super_WritableFile)._vptr_WritableFile = local_38._vptr_WritableFile;
      local_38._vptr_WritableFile = (_func_int **)0x0;
    }
    if (local_38._vptr_WritableFile != (_func_int **)0x0) {
      operator_delete__(local_38._vptr_WritableFile);
    }
  }
  else {
    (this->super_WritableFile)._vptr_WritableFile = (_func_int **)0x0;
  }
  return (Status)(char *)this;
}

Assistant:

Status Append(const Slice& data) override {
    size_t write_size = data.size();
    const char* write_data = data.data();

    // Fit as much as possible into buffer.
    size_t copy_size = std::min(write_size, kWritableFileBufferSize - pos_);
    std::memcpy(buf_ + pos_, write_data, copy_size);
    write_data += copy_size;
    write_size -= copy_size;
    pos_ += copy_size;
    if (write_size == 0) {
      return Status::OK();
    }

    // Can't fit in buffer, so need to do at least one write.
    Status status = FlushBuffer();
    if (!status.ok()) {
      return status;
    }

    // Small writes go to buffer, large writes are written directly.
    if (write_size < kWritableFileBufferSize) {
      std::memcpy(buf_, write_data, write_size);
      pos_ = write_size;
      return Status::OK();
    }
    return WriteUnbuffered(write_data, write_size);
  }